

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

spv_result_t __thiscall
anon_unknown.dwarf_490c93::Parser::exhaustedInputDiagnostic
          (Parser *this,size_t inst_offset,Op opcode,spv_operand_type_t type)

{
  spv_result_t sVar1;
  DiagnosticStream *pDVar2;
  char *local_218;
  char *local_210;
  char *local_208;
  DiagnosticStream local_200;
  
  diagnostic(&local_200,this,SPV_ERROR_INVALID_BINARY);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_200,"End of input reached while decoding Op",0x26);
  local_208 = spvOpcodeString(opcode);
  pDVar2 = spvtools::DiagnosticStream::operator<<(&local_200,&local_208);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar2," starting at word ",0x12);
  std::ostream::_M_insert<unsigned_long>((ulong)pDVar2);
  local_210 = ": missing ";
  if ((this->_).word_index < (this->_).num_words) {
    local_210 = ": truncated ";
  }
  pDVar2 = spvtools::DiagnosticStream::operator<<(pDVar2,&local_210);
  local_218 = spvOperandTypeStr(type);
  pDVar2 = spvtools::DiagnosticStream::operator<<(pDVar2,&local_218);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pDVar2," operand at word offset ",0x18);
  std::ostream::_M_insert<unsigned_long>((ulong)pDVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar2,".",1);
  sVar1 = pDVar2->error_;
  spvtools::DiagnosticStream::~DiagnosticStream(&local_200);
  return sVar1;
}

Assistant:

spv_result_t exhaustedInputDiagnostic(size_t inst_offset, spv::Op opcode,
                                        spv_operand_type_t type) {
    return diagnostic() << "End of input reached while decoding Op"
                        << spvOpcodeString(opcode) << " starting at word "
                        << inst_offset
                        << ((_.word_index < _.num_words) ? ": truncated "
                                                         : ": missing ")
                        << spvOperandTypeStr(type) << " operand at word offset "
                        << _.word_index - inst_offset << ".";
  }